

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O1

double __thiscall uttt::EvalMcts::operator()(EvalMcts *this,IBoard *board)

{
  IPlayer IVar1;
  int iVar2;
  longlong in_RCX;
  MCTSResults *result;
  pointer pMVar3;
  double dVar4;
  double dVar5;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> results;
  vector<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_> local_30;
  
  iVar2 = IBoard::GetStatus(board);
  if (iVar2 == -1) {
    mcts::MCTS_parallel<uttt::IBoard,mcts::RandomPlayout<uttt::IBoard>>
              (&local_30,(mcts *)board,(IBoard *)0x64,in_RCX);
    if (local_30.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_30.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      dVar4 = -1.1;
    }
    else {
      pMVar3 = local_30.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar5 = -1.1;
      do {
        dVar4 = pMVar3->value / (double)pMVar3->total;
        if (dVar4 <= dVar5) {
          dVar4 = dVar5;
        }
        pMVar3 = pMVar3 + 1;
        dVar5 = dVar4;
      } while (pMVar3 != local_30.
                         super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_30.super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<mcts::MCTSResults,_std::allocator<mcts::MCTSResults>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    dVar4 = 0.0;
    if (iVar2 != 0) {
      IVar1 = IBoard::GetPlayerToMove(board);
      dVar4 = *(double *)(&DAT_00151090 + (ulong)(iVar2 == IVar1) * 8);
    }
  }
  return dVar4;
}

Assistant:

double
EvalMcts::operator()(const IBoard &board) const
{
    int status = board.GetStatus();
    if (status == game::Draw)
        return 0.0;
    if (status != game::Undecided)
    {
        if (board.GetPlayerToMove() == status)
            return std::numeric_limits<double>::max();
        return -std::numeric_limits<double>::max();
    }
    auto results = mcts::MCTS_parallel<IBoard>(board, 100);
    double max = -1.1;
    for (const auto &result : results)
        max = std::max(max, result.value / result.total);
    return max;
}